

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flash.c
# Opt level: O1

void complete_flash_command(gbamem_t *mem,gbabus_t *bus)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint extraout_EDX;
  gbamem_t *mem_00;
  
  uVar4 = 0x12a6e0;
  switch(mem->flash_command << 0x1c | mem->flash_command - 0xaa5510 >> 4) {
  case 0:
    uVar4 = 0x12a6e0;
    complete_flash_command_cold_1();
  default:
    mem_00 = (gbamem_t *)&mem->flash_command;
    complete_flash_command_cold_2();
    bVar3 = (byte)uVar4;
    switch(mem_00->flash_state) {
    case FLASH_READY:
    case FLASH_CHIP_ID:
      if (extraout_EDX != 0xe005555) {
LAB_00121560:
        write_byte_flash_cold_9();
        goto LAB_00121567;
      }
      if (bVar3 != 0xf0) {
        mem_00->flash_command = uVar4 & 0xff;
        mem_00->flash_state = FLASH_CMD_1;
        return;
      }
      break;
    case FLASH_CMD_1:
      if (extraout_EDX == 0xe002aaa) {
        mem_00->flash_command = uVar4 & 0xff | mem_00->flash_command << 8;
        mem_00->flash_state = FLASH_CMD_2;
        return;
      }
      goto LAB_00121578;
    case FLASH_CMD_2:
      if (extraout_EDX == 0xe005555) {
        mem_00->flash_command = uVar4 & 0xff | mem_00->flash_command << 8;
        complete_flash_command(mem_00,(gbabus_t *)&switchD_001212fa::switchdataD_0012a71c);
        return;
      }
      goto LAB_0012157f;
    case FLASH_ERASE:
      if (extraout_EDX == 0xe005555) {
        mem_00->flash_command = uVar4 & 0xff;
        mem_00->flash_state = FLASH_ERASE_1;
        return;
      }
LAB_00121567:
      write_byte_flash_cold_6();
LAB_0012156e:
      write_byte_flash_cold_1();
LAB_00121578:
      write_byte_flash_cold_8();
LAB_0012157f:
      write_byte_flash_cold_7();
LAB_00121586:
      write_byte_flash_cold_3();
LAB_0012158b:
      write_byte_flash_cold_5();
LAB_00121592:
      write_byte_flash_cold_2();
    case FLASH_ERASE_1:
      if (extraout_EDX == 0xe002aaa) {
        mem_00->flash_command = uVar4 & 0xff | mem_00->flash_command << 8;
        mem_00->flash_state = FLASH_ERASE_2;
        return;
      }
      goto LAB_0012158b;
    case FLASH_ERASE_2:
      uVar4 = uVar4 & 0xff | mem_00->flash_command << 8;
      mem_00->flash_command = uVar4;
      if (uVar4 == 0xaa5510 && extraout_EDX == 0xe005555) {
        memset(mem_00->backup,0xff,mem_00->backup_size);
        ((interrupt_master_enable_t *)((long)bus + 2))->field_0 =
             *(anon_struct_2_1_53b916c1_for_interrupt_master_enable_0 *)bus;
        *(ushort *)bus =
             (ushort)*(anon_struct_2_1_53b916c1_for_interrupt_master_enable_0 *)bus & 0xfffe;
      }
      else {
        iVar2 = 0;
        do {
          iVar5 = 0;
          if (*(int *)((long)bus + 0xd0) == 4) {
            iVar5 = (uint)mem_00->flash_bank * 0x10000 - (uint)mem_00->flash_bank;
          }
          uVar6 = (ulong)(iVar5 + (extraout_EDX & 0xf000) + iVar2);
          if (mem_00->backup_size <= uVar6) {
            write_byte_flash_cold_4();
            goto LAB_00121560;
          }
          mem_00->backup[uVar6] = 0xff;
          iVar2 = iVar2 + 1;
        } while (iVar2 != 0x1000);
      }
      mem_00->backup_dirty = true;
      break;
    case FLASH_ERASE_WRITE_SECTOR:
      if (mem_00->flash_erase_write_sector_first_address == 0) {
        mem_00->flash_erase_write_sector_first_address = extraout_EDX;
      }
      uVar1 = extraout_EDX & 0xffff;
      uVar4 = uVar1;
      if ((*(backup_type_t *)((long)bus + 0xd0) == FLASH128K) &&
         (uVar4 = uVar1 + 0xffff, mem_00->flash_bank != '\x01')) {
        uVar4 = uVar1;
      }
      if ((ulong)uVar4 < mem_00->backup_size) {
        mem_00->backup[uVar4] = bVar3;
        if (extraout_EDX - 0x7f == mem_00->flash_erase_write_sector_first_address) {
          bus->interrupt_master_enable = *(interrupt_master_enable_t *)((long)bus + 2);
          mem_00->flash_erase_write_sector_first_address = 0;
          mem_00->flash_state = FLASH_READY;
        }
        goto LAB_001214f3;
      }
      goto LAB_00121586;
    case FLASH_WRITE_SINGLE_BYTE:
      uVar1 = extraout_EDX & 0xffff;
      uVar4 = uVar1;
      if ((*(int *)((long)bus + 0xd0) == 4) &&
         (uVar4 = uVar1 + 0xffff, mem_00->flash_bank != '\x01')) {
        uVar4 = uVar1;
      }
      mem_00->backup[uVar4] = bVar3;
      mem_00->flash_state = FLASH_READY;
LAB_001214f3:
      mem_00->backup_dirty = true;
      return;
    case FLASH_BANKSWITCH:
      if (extraout_EDX != 0xe000000) goto LAB_0012156e;
      if (1 < bVar3) goto LAB_00121592;
      mem_00->flash_bank = bVar3;
      break;
    default:
      goto switchD_001212fa_default;
    }
    mem_00->flash_state = FLASH_READY;
switchD_001212fa_default:
    return;
  case 7:
    mem->flash_state = FLASH_ERASE;
    break;
  case 8:
    mem->flash_state = FLASH_CHIP_ID;
    break;
  case 9:
    if (atmel) {
      mem->flash_state = FLASH_ERASE_WRITE_SECTOR;
    }
    else {
      mem->flash_state = FLASH_WRITE_SINGLE_BYTE;
    }
    break;
  case 10:
    mem->flash_state = FLASH_BANKSWITCH;
    break;
  case 0xe:
    mem->flash_state = FLASH_READY;
  }
  return;
}

Assistant:

void complete_flash_command(gbamem_t* mem, gbabus_t* bus) {
    switch (mem->flash_command) {
        case FLASHC_CHIP_ID:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_CHIP_ID\n");
#endif
            mem->flash_state = FLASH_CHIP_ID;
            break;
        case FLASHC_EXIT_CHIP_ID:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_EXIT_CHIP_ID\n");
#endif
            mem->flash_state = FLASH_READY;
            break;
        case FLASHC_BANKSWITCH:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_BANKSWITCH\n");
#endif
            mem->flash_state = FLASH_BANKSWITCH;
            break;
        case FLASHC_ERASE:
#ifdef FLASH_VERBOSE_LOG
            printf("FLASHC_ERASE\n");
#endif
            mem->flash_state = FLASH_ERASE;
            break;
        case FLASHC_WRITE_DATA:
            if (atmel) {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASH_ERASE_WRITE_SECTOR\n");
#endif
                mem->flash_state = FLASH_ERASE_WRITE_SECTOR;
            } else {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASH_WRITE_SINGLE_BYTE\n");
#endif
                mem->flash_state = FLASH_WRITE_SINGLE_BYTE;
            }
            break;
        case FLASHC_ERASE_ENTIRE_CHIP:
            logfatal("FLASHC_ERASE_ENTIRE_CHIP should be handled by the state machine below, as it is a subcommand.")
        default:
            logfatal("Unimplemented flash command: 0x%06X", mem->flash_command)
    }
}